

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_ppm_file_intern(ConstPtr *image,string *filename)

{
  ushort uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  FileException *this_00;
  int *piVar7;
  invalid_argument *piVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  long local_258;
  ofstream out;
  int aiStack_238 [54];
  ios_base local_160 [264];
  size_type *local_58;
  string magic_number;
  ValueType value;
  
  peVar2 = (image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Null image given");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_58 = &magic_number._M_string_length;
  magic_number._M_dataplus._M_p = (pointer)0x0;
  magic_number._M_string_length._0_1_ = 0;
  iVar3 = peVar2->c;
  if (iVar3 == 3) {
    pcVar9 = "P6";
  }
  else {
    if (iVar3 != 1) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Supports 1 and 3 channel images only");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pcVar9 = "P5";
  }
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)pcVar9);
  iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->_vptr_ImageBase[6])();
  iVar11 = 0xff;
  if (iVar3 != 1) {
    iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->_vptr_ImageBase[6])();
    iVar11 = 0xffff;
    if (iVar3 != 2) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Invalid image format");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::ofstream::ofstream(&local_258,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_238 + *(long *)(local_258 + -0x18)) == 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_258,(char *)local_58,(long)magic_number._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,anon_var_dwarf_2a17d + 10,1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&local_258,
                        ((image->
                         super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->w);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((image->
                                super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->h);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,anon_var_dwarf_2a17d + 10,1);
    iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->_vptr_ImageBase[6])();
    peVar2 = (image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (iVar3 == 1) {
      iVar3 = (*peVar2->_vptr_ImageBase[4])();
      (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_ImageBase[3])();
      std::ostream::write((char *)&local_258,CONCAT44(extraout_var,iVar3));
    }
    else {
      if (peVar2 == (element_type *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(peVar2,&ImageBase::typeinfo,&Image<unsigned_short>::typeinfo,0);
      }
      this = (image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      lVar6 = *(long *)(lVar5 + 0x18);
      if (0 < (int)((ulong)(*(long *)(lVar5 + 0x20) - lVar6) >> 1)) {
        lVar10 = 0;
        do {
          uVar1 = *(ushort *)(lVar6 + lVar10 * 2);
          magic_number.field_2._14_2_ = uVar1 << 8 | uVar1 >> 8;
          std::ostream::write((char *)&local_258,(long)((long)&magic_number.field_2 + 0xe));
          lVar10 = lVar10 + 1;
          lVar6 = *(long *)(lVar5 + 0x18);
        } while (lVar10 < (int)((ulong)(*(long *)(lVar5 + 0x20) - lVar6) >> 1));
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
    std::ofstream::close();
    local_258 = _VTT;
    *(undefined8 *)((long)&local_258 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&out);
    std::ios_base::~ios_base(local_160);
    if (local_58 != &magic_number._M_string_length) {
      operator_delete(local_58);
    }
    return;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x48);
  piVar7 = __errno_location();
  pcVar9 = strerror(*piVar7);
  util::FileException::FileException(this_00,filename,pcVar9);
  __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
}

Assistant:

void
save_ppm_file_intern (ImageBase::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "P5";
    else if (image->channels() == 3)
        magic_number = "P6";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

    int maxval = 0;
    if (image->get_type() == IMAGE_TYPE_UINT8)
        maxval = 255;
    else if (image->get_type() == IMAGE_TYPE_UINT16)
        maxval = 65535;
    else
        throw std::invalid_argument("Invalid image format");

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << maxval << "\n";

    if (image->get_type() == IMAGE_TYPE_UINT8)
    {
        /* Byte images can be saved as-is. */
        out.write(image->get_byte_pointer(), image->get_byte_size());
    }
    else
    {
        /* PPM is big-endian, so we need to convert 16 bit data. */
        RawImage::ConstPtr handle
            = std::dynamic_pointer_cast<RawImage const>(image);
        for (int i = 0; i < handle->get_value_amount(); ++i)
        {
            RawImage::ValueType value = util::system::betoh(handle->at(i));
            out.write((char const*)(&value), sizeof(RawImage::ValueType));
        }
    }
    out.close();
}